

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * build_pax_attribute_name(char *dest,char *src)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  char *p;
  char buff [64];
  char *local_60;
  char local_58 [64];
  char *local_18;
  size_t in_stack_fffffffffffffff8;
  
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    strcpy(in_RDI,"PaxHeader/blank");
  }
  else {
    local_18 = in_RSI;
    sVar1 = strlen(in_RSI);
    local_60 = in_RSI + sVar1;
    while( true ) {
      for (; (local_18 < local_60 && (local_60[-1] == '/')); local_60 = local_60 + -1) {
      }
      if ((local_60 <= local_18 + 1) || ((local_60[-1] != '.' || (local_60[-2] != '/')))) break;
      local_60 = local_60 + -1;
    }
    if (local_60 == local_18) {
      strcpy(in_RDI,"/PaxHeader/rootdir");
    }
    else if ((*local_18 == '.') && (local_60 == local_18 + 1)) {
      strcpy(in_RDI,"PaxHeader/currentdir");
    }
    else {
      strcpy(local_58,"PaxHeader");
      build_ustar_entry_name(p,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

static char *
build_pax_attribute_name(char *dest, const char *src)
{
	char buff[64];
	const char *p;

	/* Handle the null filename case. */
	if (src == NULL || *src == '\0') {
		strcpy(dest, "PaxHeader/blank");
		return (dest);
	}

	/* Prune final '/' and other unwanted final elements. */
	p = src + strlen(src);
	for (;;) {
		/* Ends in "/", remove the '/' */
		if (p > src && p[-1] == '/') {
			--p;
			continue;
		}
		/* Ends in "/.", remove the '.' */
		if (p > src + 1 && p[-1] == '.'
		    && p[-2] == '/') {
			--p;
			continue;
		}
		break;
	}

	/* Pathological case: After above, there was nothing left.
	 * This includes "/." "/./." "/.//./." etc. */
	if (p == src) {
		strcpy(dest, "/PaxHeader/rootdir");
		return (dest);
	}

	/* Convert unadorned "." into a suitable filename. */
	if (*src == '.' && p == src + 1) {
		strcpy(dest, "PaxHeader/currentdir");
		return (dest);
	}

	/*
	 * TODO: Push this string into the 'pax' structure to avoid
	 * recomputing it every time.  That will also open the door
	 * to having clients override it.
	 */
#if HAVE_GETPID && 0  /* Disable this for now; see above comment. */
	sprintf(buff, "PaxHeader.%d", getpid());
#else
	/* If the platform can't fetch the pid, don't include it. */
	strcpy(buff, "PaxHeader");
#endif
	/* General case: build a ustar-compatible name adding
	 * "/PaxHeader/". */
	build_ustar_entry_name(dest, src, p - src, buff);

	return (dest);
}